

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::forceCloseWithDelay(TcpConnection *this,double seconds)

{
  EventLoop *this_00;
  WeakCallback<sznet::net::TcpConnection> local_80;
  TimerCallback local_50;
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  double local_20;
  
  if ((this->m_state & ~kConnecting) == kConnected) {
    this->m_state = kDisconnecting;
    this_00 = this->m_loop;
    local_20 = seconds;
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              (local_30,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    makeWeakCallback<sznet::net::TcpConnection>
              (&local_80,(sznet *)local_30,(shared_ptr<sznet::net::TcpConnection> *)forceClose,0);
    std::function<void()>::function<sznet::WeakCallback<sznet::net::TcpConnection>,void>
              ((function<void()> *)&local_50,&local_80);
    EventLoop::runAfter(this_00,local_20,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    WeakCallback<sznet::net::TcpConnection>::~WeakCallback(&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  return;
}

Assistant:

void TcpConnection::forceCloseWithDelay(double seconds)
{
	if (m_state == kConnected || m_state == kDisconnecting)
	{
		setState(kDisconnecting);
		// not forceCloseInLoop to avoid race condition
		m_loop->runAfter(
			seconds,
			makeWeakCallback(shared_from_this(),
				&TcpConnection::forceClose));
	}
}